

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.h
# Opt level: O2

void std::
     __move_median_to_first<__gnu_cxx::__normal_iterator<BPDT_PARTITION_INFO_*,std::vector<BPDT_PARTITION_INFO_,std::allocator<BPDT_PARTITION_INFO_>>>,__gnu_cxx::__ops::_Iter_less_iter>
               (undefined8 *__result,undefined8 *__a,undefined8 *__b,undefined8 *__c)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  
  uVar1 = *(uint *)((long)__a + 4);
  uVar2 = *(uint *)((long)__b + 4);
  uVar3 = *(uint *)((long)__c + 4);
  if (uVar1 < uVar2) {
    if (uVar2 < uVar3) {
LAB_00125923:
      uVar4 = __result[4];
      uVar5 = *__result;
      uVar6 = __result[1];
      uVar7 = __result[2];
      uVar8 = __result[3];
      __result[4] = __b[4];
      uVar9 = *__b;
      uVar10 = __b[1];
      uVar11 = __b[3];
      __result[2] = __b[2];
      __result[3] = uVar11;
      *__result = uVar9;
      __result[1] = uVar10;
      __b[4] = uVar4;
      __b[2] = uVar7;
      __b[3] = uVar8;
      *__b = uVar5;
      __b[1] = uVar6;
      return;
    }
    if (uVar1 < uVar3) {
LAB_001258d8:
      uVar4 = __result[4];
      uVar5 = *__result;
      uVar6 = __result[1];
      uVar7 = __result[2];
      uVar8 = __result[3];
      __result[4] = __c[4];
      uVar9 = *__c;
      uVar10 = __c[1];
      uVar11 = __c[3];
      __result[2] = __c[2];
      __result[3] = uVar11;
      *__result = uVar9;
      __result[1] = uVar10;
      __c[4] = uVar4;
      __c[2] = uVar7;
      __c[3] = uVar8;
      *__c = uVar5;
      __c[1] = uVar6;
      return;
    }
  }
  else if (uVar3 <= uVar1) {
    if (uVar2 < uVar3) goto LAB_001258d8;
    goto LAB_00125923;
  }
  uVar4 = __result[4];
  uVar5 = *__result;
  uVar6 = __result[1];
  uVar7 = __result[2];
  uVar8 = __result[3];
  __result[4] = __a[4];
  uVar9 = *__a;
  uVar10 = __a[1];
  uVar11 = __a[3];
  __result[2] = __a[2];
  __result[3] = uVar11;
  *__result = uVar9;
  __result[1] = uVar10;
  __a[4] = uVar4;
  __a[2] = uVar7;
  __a[3] = uVar8;
  *__a = uVar5;
  __a[1] = uVar6;
  return;
}

Assistant:

bool operator< (const struct BPDT_PARTITION_INFO_ & lhs, const struct BPDT_PARTITION_INFO_ & rhs) { return lhs.ptEntry.Offset < rhs.ptEntry.Offset; }